

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_4::Image::clearLevels(Image *this)

{
  long lVar1;
  long lVar2;
  ImageLevel **ppIVar3;
  long in_RDI;
  int x;
  int y;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffa8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffb0;
  Vec2<int> *in_stack_ffffffffffffffb8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  int iVar4;
  Vec2<int> local_28;
  Vec2<int> local_20 [4];
  
  Imath_3_2::Vec2<int>::Vec2(local_20,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_28,-1,-1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  iVar4 = 0;
  while( true ) {
    lVar1 = (long)iVar4;
    lVar2 = Array2D<Imf_3_4::ImageLevel_*>::height
                      ((Array2D<Imf_3_4::ImageLevel_*> *)(in_RDI + 0x50));
    if (lVar2 <= lVar1) break;
    in_stack_ffffffffffffffd0 = 0;
    while( true ) {
      lVar1 = (long)in_stack_ffffffffffffffd0;
      lVar2 = Array2D<Imf_3_4::ImageLevel_*>::width
                        ((Array2D<Imf_3_4::ImageLevel_*> *)(in_RDI + 0x50));
      if (lVar2 <= lVar1) break;
      ppIVar3 = Array2D<Imf_3_4::ImageLevel_*>::operator[]
                          ((Array2D<Imf_3_4::ImageLevel_*> *)(in_RDI + 0x50),(long)iVar4);
      if (ppIVar3[in_stack_ffffffffffffffd0] != (ImageLevel *)0x0) {
        (*ppIVar3[in_stack_ffffffffffffffd0]->_vptr_ImageLevel[1])();
      }
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
    }
    iVar4 = iVar4 + 1;
  }
  Array2D<Imf_3_4::ImageLevel_*>::resizeErase
            ((Array2D<Imf_3_4::ImageLevel_*> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),in_RDI,
             lVar1);
  return;
}

Assistant:

void
Image::clearLevels ()
{
    _dataWindow = Box2i (V2i (0, 0), V2i (-1, -1));

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            delete _levels[y][x];

    _levels.resizeErase (0, 0);
}